

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O3

bool spvtools::opt::anon_unknown_0::CompositeInsertToCompositeConstruct
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  OperandList *this;
  _Rb_tree_header *p_Var1;
  IRContext *pIVar2;
  int *piVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  array<signed_char,_4UL> aVar8;
  Instruction *pIVar9;
  Type *pTVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar11;
  PodType aPVar12 [2];
  undefined4 extraout_var_01;
  ulong uVar13;
  undefined4 extraout_var_02;
  uint uVar14;
  pointer pOVar15;
  uint uVar16;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var17;
  ulong uVar18;
  byte bVar19;
  __aligned_membuf<std::pair<const_unsigned_int,_unsigned_int>_> _Var20;
  iterator iVar21;
  byte bVar22;
  _Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var23;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var24;
  DefUseManager *pDVar25;
  InstructionBuilder ir_builder;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  values_inserted;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids_in_order;
  undefined1 local_e0 [8];
  undefined1 local_d8 [24];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_c0;
  __aligned_membuf<std::pair<const_unsigned_int,_unsigned_int>_> local_b8;
  __aligned_membuf<std::pair<const_unsigned_int,_unsigned_int>_> local_b0;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_a8;
  undefined1 local_78 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (inst->opcode_ != OpCompositeInsert) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert && \"Wrong opcode.  Should be OpCompositeInsert.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x862,
                  "bool spvtools::opt::(anonymous namespace)::CompositeInsertToCompositeConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar16 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar16 = (uint)inst->has_result_id_;
  }
  if ((int)((ulong)((long)(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar16 < 3
     ) {
    return false;
  }
  pIVar2 = inst->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
    pDVar25 = (pIVar2->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    local_d8._16_8_ = local_d8;
    local_d8._0_8_ = (ulong)(uint)local_d8._4_4_ << 0x20;
    local_d8._8_8_ = (Instruction *)0x0;
    local_b8._M_storage[0] = '\0';
    local_b8._M_storage[1] = '\0';
    local_b8._M_storage[2] = '\0';
    local_b8._M_storage[3] = '\0';
    local_b8._M_storage[4] = '\0';
    local_b8._M_storage[5] = '\0';
    local_b8._M_storage[6] = '\0';
    local_b8._M_storage[7] = '\0';
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8._16_8_;
    if (inst->opcode_ == OpCompositeInsert) goto LAB_0056df1d;
LAB_0056e0e3:
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a8._M_impl.super__Rb_tree_header._M_header;
    _Var20._M_storage = (uchar  [8])&local_a8._M_impl.super__Rb_tree_header._M_node_count;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    pDVar25 = (pIVar2->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    local_d8._0_8_ = (ulong)(uint)local_d8._4_4_ << 0x20;
LAB_0056df1d:
    local_b0._M_storage = (uchar  [8])&local_b8;
    local_b8._M_storage[0] = '\0';
    local_b8._M_storage[1] = '\0';
    local_b8._M_storage[2] = '\0';
    local_b8._M_storage[3] = '\0';
    local_b8._M_storage[4] = '\0';
    local_b8._M_storage[5] = '\0';
    local_b8._M_storage[6] = '\0';
    local_b8._M_storage[7] = '\0';
    local_d8._8_8_ = (Instruction *)0x0;
    pIVar9 = inst;
    local_d8._16_8_ = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8;
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8;
    do {
      uVar16 = (pIVar9->has_result_id_ & 1) + 1;
      if (pIVar9->has_type_id_ == false) {
        uVar16 = (uint)pIVar9->has_result_id_;
      }
      uVar14 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar14 = (uint)inst->has_result_id_;
      }
      uVar14 = (int)((ulong)((long)(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
               uVar14;
      if (uVar14 < (int)((ulong)((long)(pIVar9->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pIVar9->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555
                   - uVar16) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uVar16 + uVar14) - 1);
        _Var24._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8;
        iVar21.node_ = (Instruction *)local_d8._8_8_;
        if ((Instruction *)local_d8._8_8_ != (Instruction *)0x0) {
          do {
            _Var17._M_head_impl =
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)iVar21.node_;
            _Var23.
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 )(_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   )_Var24._M_head_impl;
            uVar16 = (uint)*(size_t *)
                            ((__aligned_membuf<std::pair<const_unsigned_int,_unsigned_int>_> *)
                            &((Instruction *)_Var17._M_head_impl)->context_)->_M_storage;
            _Var24._M_head_impl = _Var17._M_head_impl;
            if (uVar16 < uVar5) {
              _Var24._M_head_impl =
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   _Var23.
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl;
            }
            iVar21.node_ = (Instruction *)
                           (&((_Rb_tree_node_base *)
                             &((Instruction *)_Var17._M_head_impl)->
                              super_IntrusiveNodeBase<spvtools::opt::Instruction>)->_M_left)
                           [uVar16 < uVar5];
          } while (iVar21.node_ != (Instruction *)0x0);
          if (_Var24._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8
             ) {
            if (uVar16 < uVar5) {
              _Var17._M_head_impl =
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   _Var23.
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl;
            }
            if (*(uint *)((long)(_Var17._M_head_impl + 1) + 8) <= uVar5) goto LAB_0056dfd2;
          }
        }
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl._0_4_ = 0;
        local_a8._M_impl._4_4_ = 0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_node_count._0_1_ = '\0';
        local_a8._M_impl.super__Rb_tree_header._M_node_count._1_1_ = '\0';
        local_a8._M_impl.super__Rb_tree_header._M_node_count._2_1_ = '\0';
        local_a8._M_impl.super__Rb_tree_header._M_node_count._3_1_ = '\0';
        local_a8._M_impl.super__Rb_tree_header._M_node_count._4_1_ = '\0';
        local_a8._M_impl.super__Rb_tree_header._M_node_count._5_1_ = '\0';
        local_a8._M_impl.super__Rb_tree_header._M_node_count._6_1_ = '\0';
        local_a8._M_impl.super__Rb_tree_header._M_node_count._7_1_ = '\0';
        iVar21.node_ = (Instruction *)local_d8._8_8_;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        goto LAB_0056e10c;
      }
LAB_0056dfd2:
      bVar4 = HaveSameIndexesExceptForLast(inst,pIVar9);
      if (bVar4) {
        uVar6 = Instruction::GetSingleWordOperand
                          (pIVar9,(int)((ulong)((long)(pIVar9->operands_).
                                                                                                            
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(pIVar9->operands_).
                                                                                                          
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                  -0x55555555 - 1);
        uVar5 = (pIVar9->has_result_id_ & 1) + 1;
        if (pIVar9->has_type_id_ == false) {
          uVar5 = (uint)pIVar9->has_result_id_;
        }
        local_a8._M_impl._4_4_ = Instruction::GetSingleWordOperand(pIVar9,uVar5);
        local_a8._M_impl._0_4_ = uVar6;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
        ::_M_insert_unique<std::pair<unsigned_int_const,unsigned_int>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                    *)local_e0,(pair<const_unsigned_int,_unsigned_int> *)&local_a8);
      }
      uVar16 = (pIVar9->has_result_id_ & 1) + 1;
      if (pIVar9->has_type_id_ == false) {
        uVar16 = (uint)pIVar9->has_result_id_;
      }
      uVar5 = Instruction::GetSingleWordOperand(pIVar9,uVar16 + 1);
      pIVar9 = analysis::DefUseManager::GetDef(pDVar25,uVar5);
    } while (pIVar9->opcode_ == OpCompositeInsert);
    if ((Instruction *)local_d8._8_8_ == (Instruction *)0x0) goto LAB_0056e0e3;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_d8._8_8_;
    ((_Rb_tree_node_base *)local_d8._8_8_)->_M_parent =
         &local_a8._M_impl.super__Rb_tree_header._M_header;
    local_a8._M_impl.super__Rb_tree_header._M_node_count._0_1_ = local_b8._M_storage[0];
    local_a8._M_impl.super__Rb_tree_header._M_node_count._1_1_ = local_b8._M_storage[1];
    local_a8._M_impl.super__Rb_tree_header._M_node_count._2_1_ = local_b8._M_storage[2];
    local_a8._M_impl.super__Rb_tree_header._M_node_count._3_1_ = local_b8._M_storage[3];
    local_a8._M_impl.super__Rb_tree_header._M_node_count._4_1_ = local_b8._M_storage[4];
    local_a8._M_impl.super__Rb_tree_header._M_node_count._5_1_ = local_b8._M_storage[5];
    local_a8._M_impl.super__Rb_tree_header._M_node_count._6_1_ = local_b8._M_storage[6];
    local_a8._M_impl.super__Rb_tree_header._M_node_count._7_1_ = local_b8._M_storage[7];
    local_d8._8_8_ = (Instruction *)0x0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_d8._16_8_;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_c0._M_head_impl;
    _Var20._M_storage = local_b0._M_storage;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_color = local_d8._0_4_;
    local_d8._16_8_ = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8;
    local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8;
  }
  *(uchar (*) [8])_Var20._M_storage = (uchar  [8])0x0;
  iVar21.node_ = (Instruction *)0x0;
LAB_0056e10c:
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::_M_erase((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)local_e0,(_Link_type)iVar21.node_);
  if (inst->opcode_ != OpCompositeInsert) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x833,
                  "uint32_t spvtools::opt::(anonymous namespace)::GetContainerTypeId(Instruction *)"
                 );
  }
  pIVar2 = inst->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  pDVar25 = (pIVar2->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar5 = 0;
  if (inst->has_type_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(inst,0);
  }
  uVar5 = GetElementType(uVar5,(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4,
                         (inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1,pDVar25);
  if (uVar5 != 0) {
    if ((context->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(context);
    }
    pTVar10 = analysis::TypeManager::GetType
                        ((context->type_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                         _M_head_impl,uVar5);
    if (pTVar10 == (Type *)0x0) {
      __assert_fail("container_type && \"GetContainerTypeId returned a bad id.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x86d,
                    "bool spvtools::opt::(anonymous namespace)::CompositeInsertToCompositeConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                   );
    }
    iVar7 = (*pTVar10->_vptr_Type[0xe])(pTVar10);
    lVar11 = CONCAT44(extraout_var,iVar7);
    if (lVar11 == 0) {
      iVar7 = (*pTVar10->_vptr_Type[0x10])(pTVar10);
      lVar11 = CONCAT44(extraout_var_00,iVar7);
      if (lVar11 != 0) goto LAB_0056e1c0;
      iVar7 = (*pTVar10->_vptr_Type[0x1e])(pTVar10);
      lVar11 = CONCAT44(extraout_var_01,iVar7);
      if (lVar11 == 0) {
        iVar7 = (*pTVar10->_vptr_Type[0x18])(pTVar10);
        lVar11 = CONCAT44(extraout_var_02,iVar7);
        if (lVar11 == 0) {
          uVar18 = 0;
        }
        else {
          piVar3 = *(int **)(lVar11 + 0x38);
          uVar18 = 0xffffffff;
          if ((*piVar3 == 0) && (*(long *)(lVar11 + 0x40) - (long)piVar3 == 8)) {
            uVar18 = (ulong)(uint)piVar3[1];
          }
        }
      }
      else {
        uVar18 = (ulong)(*(long *)(lVar11 + 0x30) - *(long *)(lVar11 + 0x28)) >> 3;
      }
    }
    else {
LAB_0056e1c0:
      uVar18 = (ulong)*(uint *)(lVar11 + 0x30);
    }
    if (local_a8._M_impl.super__Rb_tree_header._M_node_count == (uVar18 & 0xffffffff)) {
      p_Var1 = &local_a8._M_impl.super__Rb_tree_header;
      lVar11 = std::_Rb_tree_decrement(&p_Var1->_M_header);
      if (*(uint *)(lVar11 + 0x20) < (uint)uVar18) {
        pIVar2 = inst->context_;
        local_d8._0_8_ = IRContext::get_instr_block(pIVar2,inst);
        local_d8._16_4_ = (array<signed_char,_4UL>)0x3;
        local_78._0_8_ = (_func_int **)0x0;
        local_78._8_8_ = (uint *)0x0;
        local_78._16_4_ = (array<signed_char,_4UL>)0x0;
        local_78._20_4_ = (array<signed_char,_4UL>)0x0;
        local_e0 = (undefined1  [8])pIVar2;
        local_d8._8_8_ = inst;
        if ((_Rb_tree_header *)local_a8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
          aPVar12 = (PodType  [2])local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_48 = *(undefined8 *)
                        ((__aligned_membuf<std::pair<const_unsigned_int,_unsigned_int>_> *)
                        ((long)aPVar12 + 0x20))->_M_storage;
            if (local_78._8_8_ == local_78._16_8_) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_78,
                         (iterator)local_78._8_8_,(uint *)((long)&local_48 + 4));
            }
            else {
              *(uint *)local_78._8_8_ = (uint)((ulong)local_48 >> 0x20);
              local_78._8_8_ = local_78._8_8_ + 4;
            }
            aPVar12 = (PodType  [2])std::_Rb_tree_increment((_Rb_tree_node_base *)aPVar12);
          } while (aPVar12 != (PodType  [2])p_Var1);
        }
        pIVar9 = InstructionBuilder::AddCompositeConstruct
                           ((InstructionBuilder *)local_e0,uVar5,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        if ((_func_int **)local_78._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
        }
        pOVar15 = (inst->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = ((long)(inst->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar15 >> 4) *
                 -0x5555555555555555;
        bVar19 = inst->has_type_id_;
        bVar22 = inst->has_result_id_;
        uVar16 = (bVar22 & 1) + 1;
        if ((bool)bVar19 == false) {
          uVar16 = (uint)bVar22;
        }
        this = &inst->operands_;
        if ((int)uVar18 - uVar16 == 3) {
          inst->opcode_ = OpCopyObject;
          aVar8._M_elems[0] = '\0';
          aVar8._M_elems[1] = '\0';
          aVar8._M_elems[2] = '\0';
          aVar8._M_elems[3] = '\0';
          if (pIVar9->has_result_id_ == true) {
            aVar8._M_elems =
                 (_Type)Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
          }
          local_78._24_8_ = local_78 + 0x10;
          local_78._0_8_ = &PTR__SmallVector_00b02ef8;
          local_58._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_78._16_4_ = aVar8._M_elems;
          local_78._8_8_ = (uint *)0x1;
          local_e0._0_4_ = 1;
          local_d8._0_8_ = &PTR__SmallVector_00b02ef8;
          local_d8._8_8_ = (Instruction *)0x0;
          local_c0._M_head_impl =
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_d8 + 0x10);
          local_b8._M_storage[0] = '\0';
          local_b8._M_storage[1] = '\0';
          local_b8._M_storage[2] = '\0';
          local_b8._M_storage[3] = '\0';
          local_b8._M_storage[4] = '\0';
          local_b8._M_storage[5] = '\0';
          local_b8._M_storage[6] = '\0';
          local_b8._M_storage[7] = '\0';
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)local_d8,
                     (SmallVector<unsigned_int,_2UL> *)local_78);
          local_48 = 0;
          uStack_40 = 0;
          local_38 = 0;
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_initialize<spvtools::opt::Operand_const*>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &local_48,local_e0,&local_b0);
          uVar16 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar16 = (uint)inst->has_result_id_;
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    (this,(Operand *)
                          ((long)((((inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -6)
                          + (ulong)(uVar16 * 0x30)),
                     (inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)this,
                     (inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_48,uStack_40);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     &local_48);
          local_d8._0_8_ = &PTR__SmallVector_00b02ef8;
          if (local_b8._M_storage != (uchar  [8])0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_b8,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8._M_storage);
          }
          local_b8._M_storage[0] = '\0';
          local_b8._M_storage[1] = '\0';
          local_b8._M_storage[2] = '\0';
          local_b8._M_storage[3] = '\0';
          local_b8._M_storage[4] = '\0';
          local_b8._M_storage[5] = '\0';
          local_b8._M_storage[6] = '\0';
          local_b8._M_storage[7] = '\0';
          local_78._0_8_ = &PTR__SmallVector_00b02ef8;
          if (local_58._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl !=
              (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_58,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       local_58._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl);
          }
        }
        else {
          if (pIVar9->has_result_id_ == true) {
            uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
            bVar19 = inst->has_type_id_;
            bVar22 = inst->has_result_id_;
            pOVar15 = (inst->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar18 = ((long)(inst->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar15 >> 4) *
                     -0x5555555555555555;
          }
          else {
            uVar5 = 0;
          }
          local_d8._16_8_ = (long)local_d8 + 8;
          local_e0 = (undefined1  [8])&PTR__SmallVector_00b02ef8;
          local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_d8._8_4_ = uVar5;
          local_d8._0_8_ = (BasicBlock *)0x1;
          uVar13 = (ulong)(bVar22 & 1) + 1;
          if ((bVar19 & 1) == 0) {
            uVar13 = (ulong)bVar22;
          }
          if (uVar18 <= uVar13) {
            __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b8,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)
                     ((long)&((OperandData *)((pOVar15->words).buffer + -4))->_vptr_SmallVector +
                     (ulong)(uint)((int)uVar13 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_e0);
          local_e0 = (undefined1  [8])&PTR__SmallVector_00b02ef8;
          if ((PodType  [2])local_c0._M_head_impl != (PodType  [2])0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_c0,local_c0._M_head_impl);
          }
          pOVar15 = (inst->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    (this,pOVar15 + ((int)((ulong)((long)(inst->operands_).
                                                                                                                  
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pOVar15) >> 4) * -0x55555555 - 1));
        }
        bVar4 = true;
        goto LAB_0056e41f;
      }
    }
  }
  bVar4 = false;
LAB_0056e41f:
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::_M_erase(&local_a8,(_Link_type)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar4;
}

Assistant:

bool CompositeInsertToCompositeConstruct(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  assert(inst->opcode() == spv::Op::OpCompositeInsert &&
         "Wrong opcode.  Should be OpCompositeInsert.");
  if (inst->NumInOperands() < 3) return false;

  std::map<uint32_t, uint32_t> values_inserted = GetInsertedValues(inst);
  uint32_t container_type_id = GetContainerTypeId(inst);
  if (container_type_id == 0) {
    return false;
  }

  analysis::TypeManager* type_mgr = context->get_type_mgr();
  const analysis::Type* container_type = type_mgr->GetType(container_type_id);
  assert(container_type && "GetContainerTypeId returned a bad id.");
  if (!DoInsertedValuesCoverEntireObject(container_type, values_inserted)) {
    return false;
  }

  Instruction* construct =
      BuildCompositeConstruct(container_type_id, values_inserted, inst);
  InsertConstructedObject(inst, construct);
  return true;
}